

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O3

void __thiscall rengine::Node::~Node(Node *this)

{
  vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
  *pvVar1;
  pointer ppBVar2;
  
  (this->super_SignalEmitter)._vptr_SignalEmitter = (_func_int **)&PTR__Node_00133af8;
  if (this->m_parent != (Node *)0x0) {
    remove(this->m_parent,(char *)this);
  }
  while (this->m_child != (Node *)0x0) {
    (*(this->m_child->super_SignalEmitter)._vptr_SignalEmitter[2])();
  }
  (this->super_SignalEmitter)._vptr_SignalEmitter = (_func_int **)&PTR__SignalEmitter_00133aa8;
  Signal<>::emit(&SignalEmitter::onDestruction,&this->super_SignalEmitter);
  pvVar1 = (this->super_SignalEmitter).m_buckets;
  if ((pvVar1 != (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
                  *)0x0) &&
     (ppBVar2 = (pvVar1->
                super__Vector_base<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
                )._M_impl.super__Vector_impl_data._M_start, ppBVar2 != (pointer)0x0)) {
    operator_delete(ppBVar2);
  }
  operator_delete(pvVar1);
  return;
}

Assistant:

virtual ~Node() {
        if (m_parent)
            m_parent->remove(this);
        while (m_child)
            m_child->destroy();
    }